

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O0

bool __thiscall
rlottie::internal::model::Rect::roundnessChanged(Rect *this,int prevFrame,int curFrame)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined1 local_19;
  int prevFrame_00;
  
  prevFrame_00 = (int)((ulong)in_RDI >> 0x20);
  if (*(long *)(in_RDI + 0x18) == 0) {
    local_19 = Property<float,_void>::changed
                         ((Property<float,_void> *)CONCAT44(in_ESI,in_EDX),prevFrame_00,(int)in_RDI)
    ;
  }
  else {
    local_19 = Property<float,_void>::changed
                         ((Property<float,_void> *)CONCAT44(in_ESI,in_EDX),prevFrame_00,(int)in_RDI)
    ;
  }
  return local_19;
}

Assistant:

bool roundnessChanged(int prevFrame, int curFrame)
    {
        return mRoundedCorner ? mRoundedCorner->mRadius.changed(prevFrame, curFrame) :
                        mRound.changed(prevFrame, curFrame);
    }